

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_file_current_dir(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int in_ECX;
  int extraout_EDX;
  char *__s1;
  uv_fs_event_t *puVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_timer_t timer;
  code *pcStack_a0;
  undefined1 local_98 [16];
  char *local_88 [15];
  
  pcStack_a0 = (code *)0x1886dd;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1886ef;
  remove("watch_file");
  pcStack_a0 = (code *)0x1886f7;
  create_file("watch_file");
  pcStack_a0 = (code *)0x188706;
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  local_88[0] = (char *)(long)iVar1;
  local_98._0_8_ = (uv_loop_t *)0x0;
  if (local_88[0] == (char *)0x0) {
    in_ECX = 0;
    pcStack_a0 = (code *)0x188743;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file_current_dir,"watch_file");
    local_88[0] = (char *)(long)iVar1;
    local_98._0_8_ = (uv_loop_t *)0x0;
    if (local_88[0] != (char *)0x0) goto LAB_0018890d;
    pcStack_a0 = (code *)0x18876e;
    iVar1 = uv_timer_init(uVar2,local_88);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_0018891a;
    local_88[0] = "watch_file";
    in_ECX = 0;
    pcStack_a0 = (code *)0x1887a7;
    iVar1 = uv_timer_start(local_88,timer_cb_touch,0x44c);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188927;
    local_98._0_8_ = SEXT48(timer_cb_touch_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188934;
    local_98._0_8_ = SEXT48(fs_event_cb_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_00188941;
    local_98._0_8_ = SEXT48(close_cb_called);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_0018894e;
    pcStack_a0 = (code *)0x188838;
    uv_run(uVar2,0);
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_0018895b;
    local_98._0_8_ = (uv_loop_t *)0x0;
    local_98._8_8_ = SEXT48(fs_event_cb_called);
    if ((uv_loop_t *)local_98._8_8_ == (uv_loop_t *)0x0) goto LAB_00188968;
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_00188975;
    pcStack_a0 = (code *)0x1888ad;
    remove("watch_file");
    pcStack_a0 = (code *)0x1888be;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_a0 = (code *)0x1888c8;
    uv_run(uVar2,0);
    local_98._0_8_ = (uv_loop_t *)0x0;
    pcStack_a0 = (code *)0x1888d8;
    iVar1 = uv_loop_close(uVar2);
    local_98._8_8_ = SEXT48(iVar1);
    if (local_98._0_8_ == local_98._8_8_) {
      pcStack_a0 = (code *)0x1888f3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x18890d;
    run_test_fs_event_watch_file_current_dir_cold_1();
LAB_0018890d:
    pcStack_a0 = (code *)0x18891a;
    run_test_fs_event_watch_file_current_dir_cold_2();
LAB_0018891a:
    pcStack_a0 = (code *)0x188927;
    run_test_fs_event_watch_file_current_dir_cold_3();
LAB_00188927:
    pcStack_a0 = (code *)0x188934;
    run_test_fs_event_watch_file_current_dir_cold_4();
LAB_00188934:
    pcStack_a0 = (code *)0x188941;
    run_test_fs_event_watch_file_current_dir_cold_5();
LAB_00188941:
    pcStack_a0 = (code *)0x18894e;
    run_test_fs_event_watch_file_current_dir_cold_6();
LAB_0018894e:
    pcStack_a0 = (code *)0x18895b;
    run_test_fs_event_watch_file_current_dir_cold_7();
LAB_0018895b:
    pcStack_a0 = (code *)0x188968;
    run_test_fs_event_watch_file_current_dir_cold_8();
LAB_00188968:
    pcStack_a0 = (code *)0x188975;
    run_test_fs_event_watch_file_current_dir_cold_11();
LAB_00188975:
    pcStack_a0 = (code *)0x188982;
    run_test_fs_event_watch_file_current_dir_cold_9();
  }
  puVar3 = (uv_fs_event_t *)local_98;
  __s1 = local_98 + 8;
  pcStack_a0 = fs_event_cb_file_current_dir;
  run_test_fs_event_watch_file_current_dir_cold_10();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    pcStack_a0 = (code *)(long)in_ECX;
    if (pcStack_a0 != (code *)0x0) goto LAB_00188a29;
    pcStack_a0 = (code *)(long)extraout_EDX;
    if (pcStack_a0 == (code *)0x2) {
      iVar1 = strcmp(__s1,"watch_file");
      pcStack_a0 = (code *)(long)iVar1;
      if (pcStack_a0 == (code *)0x0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00188a47;
    }
  }
  else {
    fs_event_cb_file_current_dir_cold_1();
LAB_00188a29:
    fs_event_cb_file_current_dir_cold_2();
  }
  fs_event_cb_file_current_dir_cold_3();
LAB_00188a47:
  ppcVar4 = &pcStack_a0;
  fs_event_cb_file_current_dir_cold_4();
  uv_close();
  touch_file((char *)*ppcVar4);
  timer_cb_touch_called = timer_cb_touch_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_watch_file_current_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");
#if defined(__APPLE__) && !defined(MAC_OS_X_VERSION_10_12)
  /* Empirically, kevent seems to (sometimes) report the preceding
   * create_file events prior to macOS 10.11.6 in the subsequent fs_event_start
   * So let the system settle before running the test. */
  uv_sleep(1100);
  uv_update_time(loop);
#endif

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT_OK(r);


  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  timer.data = "watch_file";
  r = uv_timer_start(&timer, timer_cb_touch, 1100, 0);
  ASSERT_OK(r);

  ASSERT_OK(timer_cb_touch_called);
  ASSERT_OK(fs_event_cb_called);
  ASSERT_OK(close_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, timer_cb_touch_called);
  /* FSEvents on macOS sometimes sends one change event, sometimes two. */
  ASSERT_NE(0, fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_file");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}